

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_lex.c
# Opt level: O0

yajl_tok yajl_lex_comment(yajl_lexer lexer,uchar *jsonText,size_t jsonTextLen,size_t *offset)

{
  uchar uVar1;
  ulong uVar2;
  long lVar3;
  size_t sVar4;
  uchar *puVar5;
  ulong *in_RCX;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  yajl_tok tok;
  uchar c;
  uchar local_5c;
  uchar local_4c;
  yajl_tok local_30;
  yajl_tok local_4;
  
  local_30 = yajl_tok_comment;
  if (*in_RCX < in_RDX) {
    if (((*(int *)(in_RDI + 0x28) == 0) ||
        (sVar4 = yajl_buf_len(*(yajl_buf *)(in_RDI + 0x18)), sVar4 == 0)) ||
       (uVar2 = *(ulong *)(in_RDI + 0x20), sVar4 = yajl_buf_len(*(yajl_buf *)(in_RDI + 0x18)),
       sVar4 <= uVar2)) {
      uVar2 = *in_RCX;
      *in_RCX = uVar2 + 1;
      uVar1 = *(uchar *)(in_RSI + uVar2);
    }
    else {
      puVar5 = yajl_buf_data(*(yajl_buf *)(in_RDI + 0x18));
      lVar3 = *(long *)(in_RDI + 0x20);
      *(long *)(in_RDI + 0x20) = lVar3 + 1;
      uVar1 = puVar5[lVar3];
    }
    if (uVar1 == '/') {
      do {
        if (in_RDX <= *in_RCX) {
          return yajl_tok_eof;
        }
        if (((*(int *)(in_RDI + 0x28) == 0) ||
            (sVar4 = yajl_buf_len(*(yajl_buf *)(in_RDI + 0x18)), sVar4 == 0)) ||
           (uVar2 = *(ulong *)(in_RDI + 0x20), sVar4 = yajl_buf_len(*(yajl_buf *)(in_RDI + 0x18)),
           sVar4 <= uVar2)) {
          uVar2 = *in_RCX;
          *in_RCX = uVar2 + 1;
          local_4c = *(uchar *)(in_RSI + uVar2);
        }
        else {
          puVar5 = yajl_buf_data(*(yajl_buf *)(in_RDI + 0x18));
          lVar3 = *(long *)(in_RDI + 0x20);
          *(long *)(in_RDI + 0x20) = lVar3 + 1;
          local_4c = puVar5[lVar3];
        }
      } while (local_4c != '\n');
    }
    else if (uVar1 == '*') {
      while( true ) {
        do {
          if (in_RDX <= *in_RCX) {
            return yajl_tok_eof;
          }
          if (((*(int *)(in_RDI + 0x28) == 0) ||
              (sVar4 = yajl_buf_len(*(yajl_buf *)(in_RDI + 0x18)), sVar4 == 0)) ||
             (uVar2 = *(ulong *)(in_RDI + 0x20), sVar4 = yajl_buf_len(*(yajl_buf *)(in_RDI + 0x18)),
             sVar4 <= uVar2)) {
            uVar2 = *in_RCX;
            *in_RCX = uVar2 + 1;
            local_5c = *(uchar *)(in_RSI + uVar2);
          }
          else {
            puVar5 = yajl_buf_data(*(yajl_buf *)(in_RDI + 0x18));
            lVar3 = *(long *)(in_RDI + 0x20);
            *(long *)(in_RDI + 0x20) = lVar3 + 1;
            local_5c = puVar5[lVar3];
          }
        } while (local_5c != '*');
        if (in_RDX <= *in_RCX) {
          return yajl_tok_eof;
        }
        if (((*(int *)(in_RDI + 0x28) == 0) ||
            (sVar4 = yajl_buf_len(*(yajl_buf *)(in_RDI + 0x18)), sVar4 == 0)) ||
           (uVar2 = *(ulong *)(in_RDI + 0x20), sVar4 = yajl_buf_len(*(yajl_buf *)(in_RDI + 0x18)),
           sVar4 <= uVar2)) {
          uVar2 = *in_RCX;
          *in_RCX = uVar2 + 1;
          uVar1 = *(uchar *)(in_RSI + uVar2);
        }
        else {
          puVar5 = yajl_buf_data(*(yajl_buf *)(in_RDI + 0x18));
          lVar3 = *(long *)(in_RDI + 0x20);
          *(long *)(in_RDI + 0x20) = lVar3 + 1;
          uVar1 = puVar5[lVar3];
        }
        if (uVar1 == '/') break;
        if (*in_RCX == 0) {
          *(long *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) + -1;
        }
        else {
          *in_RCX = *in_RCX - 1;
        }
      }
    }
    else {
      *(undefined4 *)(in_RDI + 0x10) = 5;
      local_30 = yajl_tok_error;
    }
    local_4 = local_30;
  }
  else {
    local_4 = yajl_tok_eof;
  }
  return local_4;
}

Assistant:

static yajl_tok
yajl_lex_comment(yajl_lexer lexer, const unsigned char * jsonText,
                 size_t jsonTextLen, size_t * offset)
{
    unsigned char c;

    yajl_tok tok = yajl_tok_comment;

    RETURN_IF_EOF;
    c = readChar(lexer, jsonText, offset);

    /* either slash or star expected */
    if (c == '/') {
        /* now we throw away until end of line */
        do {
            RETURN_IF_EOF;
            c = readChar(lexer, jsonText, offset);
        } while (c != '\n');
    } else if (c == '*') {
        /* now we throw away until end of comment */
        for (;;) {
            RETURN_IF_EOF;
            c = readChar(lexer, jsonText, offset);
            if (c == '*') {
                RETURN_IF_EOF;
                c = readChar(lexer, jsonText, offset);
                if (c == '/') {
                    break;
                } else {
                    unreadChar(lexer, offset);
                }
            }
        }
    } else {
        lexer->error = yajl_lex_invalid_char;
        tok = yajl_tok_error;
    }

    return tok;
}